

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testCreateNewOrderSingle(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  OrdType ordType;
  Side side;
  Symbol symbol;
  HandlInst handlInst;
  ClOrdID clOrdID;
  TransactTime transactTime;
  FieldBase local_398;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  Message local_188 [344];
  
  lVar1 = GetTickCount();
  for (iVar3 = 0; iVar3 <= count; iVar3 = iVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"ORDERID",(allocator<char> *)&local_2e8);
    FIX::ClOrdID::ClOrdID((ClOrdID *)&local_238,(STRING *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    local_2e8._vptr_FieldBase._0_1_ = 0x31;
    FIX::HandlInst::HandlInst((HandlInst *)&local_290,(CHAR *)&local_2e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"LNUX",(allocator<char> *)&local_1e0);
    FIX::Symbol::Symbol((Symbol *)&local_2e8,(STRING *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    FIX::Side::Side((Side *)&local_340,"11FIX.4.2");
    FIX::TransactTime::now();
    FIX::OrdType::OrdType((OrdType *)&local_398,"1FIX.4.2");
    FIX42::NewOrderSingle::NewOrderSingle
              ((NewOrderSingle *)local_188,(ClOrdID *)&local_238,(HandlInst *)&local_290,
               (Symbol *)&local_2e8,(Side *)&local_340,(TransactTime *)&local_1e0,
               (OrdType *)&local_398);
    FIX::Message::~Message(local_188);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase(&local_1e0);
    FIX::FieldBase::~FieldBase(&local_340);
    FIX::FieldBase::~FieldBase(&local_2e8);
    FIX::FieldBase::~FieldBase(&local_290);
    FIX::FieldBase::~FieldBase(&local_238);
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testCreateNewOrderSingle(int count) {
  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::ClOrdID clOrdID("ORDERID");
    FIX::HandlInst handlInst('1');
    FIX::Symbol symbol("LNUX");
    FIX::Side side(FIX::Side_BUY);
    FIX::TransactTime transactTime = FIX::TransactTime::now();
    FIX::OrdType ordType(FIX::OrdType_MARKET);
    FIX42::NewOrderSingle(clOrdID, handlInst, symbol, side, transactTime, ordType);
  }

  return GetTickCount() - start;
}